

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O2

void CB_EVAL::copy_label(void *dst,void *src)

{
  copy_array<CB::cb_class>
            ((v_array<CB::cb_class> *)((long)dst + 8),(v_array<CB::cb_class> *)((long)src + 8));
  *(undefined4 *)dst = *src;
  return;
}

Assistant:

void copy_label(void* dst, void* src)
{
  CB_EVAL::label* ldD = (CB_EVAL::label*)dst;
  CB_EVAL::label* ldS = (CB_EVAL::label*)src;
  CB::copy_label(&(ldD->event), &(ldS)->event);
  ldD->action = ldS->action;
}